

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_tls.cc
# Opt level: O1

int aead_tls_open(EVP_AEAD_CTX *ctx,uint8_t *out,size_t *out_len,size_t max_out_len,uint8_t *nonce,
                 size_t nonce_len,uint8_t *in,size_t in_len,uint8_t *ad,size_t ad_len)

{
  evp_aead_ctx_st_state *ctx_00;
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  size_t len_00;
  int line;
  ulong in_len_00;
  HMAC_CTX *ctx_01;
  int len;
  size_t mac_len;
  size_t data_plus_mac_len;
  uint8_t ad_fixed [13];
  crypto_word_t padding_ok;
  size_t *local_c8;
  HMAC_CTX *local_c0;
  uint8_t record_mac_tmp [64];
  uint8_t mac [64];
  
  if (*(int *)((long)&ctx->state + 0x1c) == 0) {
    local_c0 = (HMAC_CTX *)((long)&ctx->state + 0x98);
    local_c8 = out_len;
    sVar5 = HMAC_size((HMAC_CTX *)local_c0);
    if (in_len < sVar5) {
      iVar3 = 0x65;
      line = 0xf9;
    }
    else if (max_out_len < in_len) {
      iVar3 = 0x67;
      line = 0x100;
    }
    else {
      sVar5 = EVP_AEAD_nonce_length(ctx->aead);
      if (sVar5 == nonce_len) {
        if (ad_len == 0xb) {
          if (in_len >> 0x1f == 0) {
            ctx_00 = &ctx->state;
            uVar2 = EVP_CIPHER_CTX_mode((EVP_CIPHER_CTX *)ctx_00);
            if (((uVar2 == 2) && ((ctx->state).opaque[0x141] == '\0')) &&
               (iVar3 = EVP_DecryptInit_ex((EVP_CIPHER_CTX *)ctx_00,(EVP_CIPHER *)0x0,(ENGINE *)0x0,
                                           (uchar *)0x0,nonce), iVar3 == 0)) {
              return 0;
            }
            iVar3 = EVP_DecryptUpdate((EVP_CIPHER_CTX *)ctx_00,out,&len,in,(int)in_len);
            if (iVar3 == 0) {
              return 0;
            }
            lVar7 = (long)len;
            iVar3 = EVP_DecryptFinal_ex((EVP_CIPHER_CTX *)ctx_00,out + lVar7,&len);
            if (iVar3 == 0) {
              return 0;
            }
            in_len_00 = len + lVar7;
            if (in_len_00 != in_len) {
              __assert_fail("total == in_len",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                            ,0x126,
                            "int aead_tls_open(const EVP_AEAD_CTX *, uint8_t *, size_t *, size_t, const uint8_t *, size_t, const uint8_t *, size_t, const uint8_t *, size_t)"
                           );
            }
            uVar2 = EVP_CIPHER_CTX_mode((EVP_CIPHER_CTX *)ctx_00);
            ctx_01 = local_c0;
            if (uVar2 == 2) {
              uVar4 = EVP_CIPHER_CTX_block_size((EVP_CIPHER_CTX *)ctx_00);
              sVar5 = HMAC_size((HMAC_CTX *)ctx_01);
              iVar3 = EVP_tls_cbc_remove_padding
                                (&padding_ok,&data_plus_mac_len,out,in_len_00,(ulong)uVar4,sVar5);
              if (iVar3 == 0) {
                iVar3 = 0x65;
                line = 0x134;
                goto LAB_0017f299;
              }
            }
            else {
              padding_ok = 0xffffffffffffffff;
              data_plus_mac_len = in_len_00;
              sVar5 = HMAC_size((HMAC_CTX *)local_c0);
              if (in_len_00 < sVar5) {
                __assert_fail("data_plus_mac_len >= HMAC_size(&tls_ctx->hmac_ctx)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                              ,0x13c,
                              "int aead_tls_open(const EVP_AEAD_CTX *, uint8_t *, size_t *, size_t, const uint8_t *, size_t, const uint8_t *, size_t, const uint8_t *, size_t)"
                             );
              }
            }
            sVar5 = data_plus_mac_len;
            sVar6 = HMAC_size((HMAC_CTX *)ctx_01);
            len_00 = sVar5 - sVar6;
            ad_fixed._0_7_ = (undefined7)*(undefined8 *)ad;
            ad_fixed._8_3_ = (undefined3)((uint)*(undefined4 *)(ad + 7) >> 8);
            ad_fixed[7] = (uint8_t)((ulong)*(undefined8 *)ad >> 0x38);
            ad_fixed._11_2_ = (ushort)len_00 << 8 | (ushort)len_00 >> 8;
            uVar2 = EVP_CIPHER_CTX_mode((EVP_CIPHER_CTX *)ctx_00);
            if ((uVar2 == 2) &&
               (iVar3 = EVP_tls_cbc_record_digest_supported((EVP_MD *)ctx_01->md), iVar3 != 0)) {
              iVar3 = EVP_tls_cbc_digest_record
                                (*(EVP_MD **)((long)&ctx->state + 0x98),mac,&mac_len,ad_fixed,out,
                                 len_00,in_len_00,(ctx->state).opaque + 0x100,
                                 (uint)(ctx->state).opaque[0x140]);
              sVar5 = mac_len;
              if (iVar3 == 0) {
                iVar3 = 0x65;
                line = 0x156;
                goto LAB_0017f299;
              }
              sVar6 = HMAC_size((HMAC_CTX *)ctx_01);
              if (sVar5 != sVar6) {
                __assert_fail("mac_len == HMAC_size(&tls_ctx->hmac_ctx)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                              ,0x159,
                              "int aead_tls_open(const EVP_AEAD_CTX *, uint8_t *, size_t *, size_t, const uint8_t *, size_t, const uint8_t *, size_t, const uint8_t *, size_t)"
                             );
              }
              ctx_01 = (HMAC_CTX *)record_mac_tmp;
              EVP_tls_cbc_copy_mac((uint8_t *)ctx_01,mac_len,out,data_plus_mac_len,in_len_00);
            }
            else {
              uVar2 = EVP_CIPHER_CTX_mode((EVP_CIPHER_CTX *)ctx_00);
              if (uVar2 == 2) {
                __assert_fail("EVP_CIPHER_CTX_mode(&tls_ctx->cipher_ctx) != EVP_CIPH_CBC_MODE",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                              ,0x160,
                              "int aead_tls_open(const EVP_AEAD_CTX *, uint8_t *, size_t *, size_t, const uint8_t *, size_t, const uint8_t *, size_t, const uint8_t *, size_t)"
                             );
              }
              iVar3 = HMAC_Init_ex(ctx_01,(void *)0x0,0,(EVP_MD *)0x0,(ENGINE *)0x0);
              if (((iVar3 == 0) || (iVar3 = HMAC_Update(ctx_01,ad_fixed,0xd), iVar3 == 0)) ||
                 ((iVar3 = HMAC_Update(ctx_01,out,len_00), iVar3 == 0 ||
                  (iVar3 = HMAC_Final(ctx_01,mac,(uint *)record_mac_tmp), iVar3 == 0)))) {
                bVar1 = false;
              }
              else {
                mac_len = (ulong)(uint)record_mac_tmp._0_4_;
                sVar5 = HMAC_size((HMAC_CTX *)ctx_01);
                if (sVar5 != (uint)record_mac_tmp._0_4_) {
                  __assert_fail("mac_len == HMAC_size(&tls_ctx->hmac_ctx)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                                ,0x16b,
                                "int aead_tls_open(const EVP_AEAD_CTX *, uint8_t *, size_t *, size_t, const uint8_t *, size_t, const uint8_t *, size_t, const uint8_t *, size_t)"
                               );
                }
                ctx_01 = (HMAC_CTX *)(out + len_00);
                bVar1 = true;
              }
              if (!bVar1) {
                return 0;
              }
            }
            iVar3 = CRYPTO_memcmp(ctx_01,mac,mac_len);
            if ((iVar3 == 0) && (padding_ok != 0)) {
              *local_c8 = len_00;
              return 1;
            }
            iVar3 = 0x65;
            line = 0x178;
          }
          else {
            iVar3 = 0x75;
            line = 0x110;
          }
        }
        else {
          iVar3 = 0x6d;
          line = 0x10a;
        }
      }
      else {
        iVar3 = 0x6f;
        line = 0x105;
      }
    }
  }
  else {
    iVar3 = 0x70;
    line = 0xf4;
  }
LAB_0017f299:
  ERR_put_error(0x1e,0,iVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                ,line);
  return 0;
}

Assistant:

static int aead_tls_open(const EVP_AEAD_CTX *ctx, uint8_t *out, size_t *out_len,
                         size_t max_out_len, const uint8_t *nonce,
                         size_t nonce_len, const uint8_t *in, size_t in_len,
                         const uint8_t *ad, size_t ad_len) {
  AEAD_TLS_CTX *tls_ctx = (AEAD_TLS_CTX *)&ctx->state;

  if (tls_ctx->cipher_ctx.encrypt) {
    // Unlike a normal AEAD, a TLS AEAD may only be used in one direction.
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_INVALID_OPERATION);
    return 0;
  }

  if (in_len < HMAC_size(&tls_ctx->hmac_ctx)) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_BAD_DECRYPT);
    return 0;
  }

  if (max_out_len < in_len) {
    // This requires that the caller provide space for the MAC, even though it
    // will always be removed on return.
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_BUFFER_TOO_SMALL);
    return 0;
  }

  if (nonce_len != EVP_AEAD_nonce_length(ctx->aead)) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_INVALID_NONCE_SIZE);
    return 0;
  }

  if (ad_len != 13 - 2 /* length bytes */) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_INVALID_AD_SIZE);
    return 0;
  }

  if (in_len > INT_MAX) {
    // EVP_CIPHER takes int as input.
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_TOO_LARGE);
    return 0;
  }

  // Configure the explicit IV.
  if (EVP_CIPHER_CTX_mode(&tls_ctx->cipher_ctx) == EVP_CIPH_CBC_MODE &&
      !tls_ctx->implicit_iv &&
      !EVP_DecryptInit_ex(&tls_ctx->cipher_ctx, NULL, NULL, NULL, nonce)) {
    return 0;
  }

  // Decrypt to get the plaintext + MAC + padding.
  size_t total = 0;
  int len;
  if (!EVP_DecryptUpdate(&tls_ctx->cipher_ctx, out, &len, in, (int)in_len)) {
    return 0;
  }
  total += len;
  if (!EVP_DecryptFinal_ex(&tls_ctx->cipher_ctx, out + total, &len)) {
    return 0;
  }
  total += len;
  assert(total == in_len);

  CONSTTIME_SECRET(out, total);

  // Remove CBC padding. Code from here on is timing-sensitive with respect to
  // |padding_ok| and |data_plus_mac_len| for CBC ciphers.
  size_t data_plus_mac_len;
  crypto_word_t padding_ok;
  if (EVP_CIPHER_CTX_mode(&tls_ctx->cipher_ctx) == EVP_CIPH_CBC_MODE) {
    if (!EVP_tls_cbc_remove_padding(
            &padding_ok, &data_plus_mac_len, out, total,
            EVP_CIPHER_CTX_block_size(&tls_ctx->cipher_ctx),
            HMAC_size(&tls_ctx->hmac_ctx))) {
      // Publicly invalid. This can be rejected in non-constant time.
      OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_BAD_DECRYPT);
      return 0;
    }
  } else {
    padding_ok = CONSTTIME_TRUE_W;
    data_plus_mac_len = total;
    // |data_plus_mac_len| = |total| = |in_len| at this point. |in_len| has
    // already been checked against the MAC size at the top of the function.
    assert(data_plus_mac_len >= HMAC_size(&tls_ctx->hmac_ctx));
  }
  size_t data_len = data_plus_mac_len - HMAC_size(&tls_ctx->hmac_ctx);

  // At this point, if the padding is valid, the first |data_plus_mac_len| bytes
  // after |out| are the plaintext and MAC. Otherwise, |data_plus_mac_len| is
  // still large enough to extract a MAC, but it will be irrelevant.

  // To allow for CBC mode which changes cipher length, |ad| doesn't include the
  // length for legacy ciphers.
  uint8_t ad_fixed[13];
  OPENSSL_memcpy(ad_fixed, ad, 11);
  ad_fixed[11] = (uint8_t)(data_len >> 8);
  ad_fixed[12] = (uint8_t)(data_len & 0xff);
  ad_len += 2;

  // Compute the MAC and extract the one in the record.
  uint8_t mac[EVP_MAX_MD_SIZE];
  size_t mac_len;
  uint8_t record_mac_tmp[EVP_MAX_MD_SIZE];
  uint8_t *record_mac;
  if (EVP_CIPHER_CTX_mode(&tls_ctx->cipher_ctx) == EVP_CIPH_CBC_MODE &&
      EVP_tls_cbc_record_digest_supported(tls_ctx->hmac_ctx.md)) {
    if (!EVP_tls_cbc_digest_record(tls_ctx->hmac_ctx.md, mac, &mac_len,
                                   ad_fixed, out, data_len, total,
                                   tls_ctx->mac_key, tls_ctx->mac_key_len)) {
      OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_BAD_DECRYPT);
      return 0;
    }
    assert(mac_len == HMAC_size(&tls_ctx->hmac_ctx));

    record_mac = record_mac_tmp;
    EVP_tls_cbc_copy_mac(record_mac, mac_len, out, data_plus_mac_len, total);
  } else {
    // We should support the constant-time path for all CBC-mode ciphers
    // implemented.
    assert(EVP_CIPHER_CTX_mode(&tls_ctx->cipher_ctx) != EVP_CIPH_CBC_MODE);

    unsigned mac_len_u;
    if (!HMAC_Init_ex(&tls_ctx->hmac_ctx, NULL, 0, NULL, NULL) ||
        !HMAC_Update(&tls_ctx->hmac_ctx, ad_fixed, ad_len) ||
        !HMAC_Update(&tls_ctx->hmac_ctx, out, data_len) ||
        !HMAC_Final(&tls_ctx->hmac_ctx, mac, &mac_len_u)) {
      return 0;
    }
    mac_len = mac_len_u;

    assert(mac_len == HMAC_size(&tls_ctx->hmac_ctx));
    record_mac = &out[data_len];
  }

  // Perform the MAC check and the padding check in constant-time. It should be
  // safe to simply perform the padding check first, but it would not be under a
  // different choice of MAC location on padding failure. See
  // EVP_tls_cbc_remove_padding.
  crypto_word_t good =
      constant_time_eq_int(CRYPTO_memcmp(record_mac, mac, mac_len), 0);
  good &= padding_ok;
  CONSTTIME_DECLASSIFY(&good, sizeof(good));
  if (!good) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_BAD_DECRYPT);
    return 0;
  }

  CONSTTIME_DECLASSIFY(&data_len, sizeof(data_len));
  CONSTTIME_DECLASSIFY(out, data_len);

  // End of timing-sensitive code.

  *out_len = data_len;
  return 1;
}